

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_os_readdir(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  char *__name;
  DIR *__dirp;
  int *piVar1;
  dirent *pdVar2;
  ulong uVar3;
  uint32_t idx;
  int err;
  int64_t iVar4;
  ulong uVar5;
  JSValue JVar6;
  JSValue val;
  
  __name = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  iVar4 = 6;
  if (__name != (char *)0x0) {
    JVar6 = JS_NewArray(ctx);
    if ((int)JVar6.tag != 6) {
      __dirp = opendir(__name);
      if (__dirp == (DIR *)0x0) {
        piVar1 = __errno_location();
        err = *piVar1;
        JS_FreeCString(ctx,__name);
      }
      else {
        JS_FreeCString(ctx,__name);
        piVar1 = __errno_location();
        *piVar1 = 0;
        pdVar2 = readdir(__dirp);
        if (pdVar2 != (dirent *)0x0) {
          idx = 0;
          do {
            val = JS_NewString(ctx,pdVar2->d_name);
            JS_DefinePropertyValueUint32(ctx,JVar6,idx,val,7);
            *piVar1 = 0;
            pdVar2 = readdir(__dirp);
            idx = idx + 1;
          } while (pdVar2 != (dirent *)0x0);
        }
        err = *piVar1;
        closedir(__dirp);
      }
      JVar6 = make_obj_error(ctx,JVar6,err);
      iVar4 = JVar6.tag;
      uVar3 = (ulong)JVar6.u.ptr & 0xffffffff00000000;
      uVar5 = (ulong)JVar6.u._0_4_;
      goto LAB_00113270;
    }
    JS_FreeCString(ctx,__name);
  }
  uVar5 = 0;
  uVar3 = 0;
LAB_00113270:
  JVar6.tag = iVar4;
  JVar6.u.ptr = (void *)(uVar5 | uVar3);
  return JVar6;
}

Assistant:

static JSValue js_os_readdir(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    const char *path;
    DIR *f;
    struct dirent *d;
    JSValue obj;
    int err;
    uint32_t len;
    
    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
    obj = JS_NewArray(ctx);
    if (JS_IsException(obj)) {
        JS_FreeCString(ctx, path);
        return JS_EXCEPTION;
    }
    f = opendir(path);
    if (!f)
        err = errno;
    else
        err = 0;
    JS_FreeCString(ctx, path);
    if (!f)
        goto done;
    len = 0;
    for(;;) {
        errno = 0;
        d = readdir(f);
        if (!d) {
            err = errno;
            break;
        }
        JS_DefinePropertyValueUint32(ctx, obj, len++,
                                     JS_NewString(ctx, d->d_name),
                                     JS_PROP_C_W_E);
    }
    closedir(f);
 done:
    return make_obj_error(ctx, obj, err);
}